

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Jupiter::Socket::Buffer::reserve(Buffer *this,size_t new_capacity)

{
  size_t sVar1;
  void *pvVar2;
  void *pvVar3;
  void *old_buffer;
  size_t new_capacity_local;
  Buffer *this_local;
  
  sVar1 = capacity(this);
  if (((sVar1 != new_capacity) && (new_capacity != 0)) && (this->m_buffer_size <= new_capacity)) {
    this->m_buffer_capacity = new_capacity;
    if (this->m_buffer_size == 0) {
      operator_delete(this->m_buffer);
      pvVar2 = operator_new(new_capacity);
      this->m_buffer = pvVar2;
    }
    else {
      pvVar2 = this->m_buffer;
      pvVar3 = operator_new(new_capacity);
      this->m_buffer = pvVar3;
      memcpy(this->m_buffer,pvVar2,this->m_buffer_size);
      operator_delete(this->m_buffer);
    }
  }
  return;
}

Assistant:

void Jupiter::Socket::Buffer::reserve(size_t new_capacity) {
	if (capacity() == new_capacity // Skip when already this size
		|| new_capacity == 0 // Don't allow empty buffers, results in 0 from recv
		|| new_capacity < m_buffer_size) { // Don't shrink smaller than what we require
		return;
	}

	// We're gonna change the buffer one way or another; update our capacity
	m_buffer_capacity = new_capacity;

	if (m_buffer_size == 0) {
		// Nothing to copy; easy mode
		::operator delete(m_buffer);
		m_buffer = ::operator new(new_capacity);
		return;
	}

	// Backup current buffer data
	void* old_buffer = m_buffer;

	// Create new buffer
	m_buffer = ::operator new(new_capacity);
	std::memcpy(m_buffer, old_buffer, m_buffer_size);

	// Nuke the old buffer
	::operator delete(m_buffer);
}